

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  reference pbVar6;
  vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  *this_00;
  pointer pcVar7;
  WrapQuotes in_R8D;
  string_view str;
  string_view str_00;
  string_view str_01;
  undefined1 auVar8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  string local_658;
  undefined1 local_638 [16];
  string local_628;
  allocator<char> local_601;
  string local_600;
  cmValue local_5e0;
  cmValue labels;
  string local_5d0;
  cmValue local_5b0;
  cmValue directoryLabels;
  string local_598;
  string local_578;
  cmStateDirectory local_558;
  undefined1 local_530 [8];
  string outP;
  cmStateSnapshot *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vec_t *__range1_1;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_4d8;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *local_4c0;
  vec_t *children;
  unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *tester;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  *__range1;
  string *i;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  iterator local_450;
  size_type local_448;
  undefined1 local_440 [8];
  cmList includesList;
  string local_420;
  cmValue local_400;
  cmValue testIncludeFiles;
  string local_3f0;
  cmValue local_3d0;
  cmValue testIncludeFile;
  string local_3c0;
  string local_3a0 [8];
  string resourceSpecFile;
  cmStateDirectory local_358;
  undefined1 local_330 [8];
  cmGeneratedFileStream fout;
  undefined1 local_a0 [8];
  string file;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  allocator<char> local_31;
  string local_30;
  cmLocalGenerator *local_10;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    return;
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8),this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_((string *)((long)&file.field_2 + 8),this->Makefile)
  ;
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)&fout.field_0x260,&(this->super_cmOutputConverter).StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&fout.field_0x260);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            ((string *)local_a0,psVar3,(char (*) [21])"/CTestTestfile.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_330,(string *)local_a0,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_330,true);
  poVar4 = std::operator<<((ostream *)local_330,
                           "# CMake generated Testfile for \n# Source directory: ");
  cmStateSnapshot::GetDirectory(&local_358,&(this->super_cmOutputConverter).StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_358);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"\n# Build directory: ");
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)((long)&resourceSpecFile.field_2 + 8),
             &(this->super_cmOutputConverter).StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                     ((cmStateDirectory *)((long)&resourceSpecFile.field_2 + 8));
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::operator<<(poVar4,
                  "\n# \n# This file includes the relevant testing commands required for \n# testing this directory and lists subdirectories to be tested as well.\n"
                 );
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"CTEST_RESOURCE_SPEC_FILE",
             (allocator<char> *)((long)&testIncludeFile.Value + 7));
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_3c0);
  std::__cxx11::string::string(local_3a0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testIncludeFile.Value + 7));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_330,"set(CTEST_RESOURCE_SPEC_FILE \"");
    poVar4 = std::operator<<(poVar4,local_3a0);
    std::operator<<(poVar4,"\")\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"TEST_INCLUDE_FILE",
             (allocator<char> *)((long)&testIncludeFiles.Value + 7));
  local_3d0 = cmMakefile::GetProperty(pcVar1,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testIncludeFiles.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)local_330,"include(\"");
    psVar3 = cmValue::operator*[abi_cxx11_(&local_3d0);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4,"\")\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"TEST_INCLUDE_FILES",
             (allocator<char> *)
             ((long)&includesList.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_400 = cmMakefile::GetProperty(pcVar1,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includesList.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_400);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_400);
    std::__cxx11::string::string((string *)&local_470,(string *)psVar3);
    local_450 = &local_470;
    local_448 = 1;
    init._M_len = 1;
    init._M_array = local_450;
    cmList::cmList((cmList *)local_440,init);
    local_738 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_450;
    do {
      local_738 = local_738 + -1;
      std::__cxx11::string::~string((string *)local_738);
    } while (local_738 != &local_470);
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_440);
    i = (string *)cmList::end_abi_cxx11_((cmList *)local_440);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar2) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar4 = std::operator<<((ostream *)local_330,"include(\"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar6);
      std::operator<<(poVar4,"\")\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)local_440);
  }
  this_00 = cmMakefile::GetTestGenerators(this->Makefile);
  __end1 = std::
           vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ::begin(this_00);
  tester = (unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
           std::
           vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_*,_std::vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>_>
                                     *)&tester), bVar2) {
    children = (vec_t *)__gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_*,_std::vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>_>
                        ::operator*(&__end1);
    pcVar7 = std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>::operator->
                       ((unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                        children);
    cmTestGenerator::Compute(pcVar7,this);
    pcVar7 = std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>::operator->
                       ((unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                        children);
    cmScriptGenerator::Generate
              (&pcVar7->super_cmScriptGenerator,(ostream *)local_330,
               (string *)((long)&file.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&config.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_*,_std::vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&__range1_1,this->Makefile);
  cmStateSnapshot::GetChildren(&local_4d8,(cmStateSnapshot *)&__range1_1);
  local_4c0 = &local_4d8;
  __end1_1 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(&local_4d8);
  i_1 = (cmStateSnapshot *)
        std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(&local_4d8);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                             *)&i_1), bVar2) {
    outP.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
         ::operator*(&__end1_1);
    cmStateSnapshot::GetDirectory(&local_558,(cmStateSnapshot *)outP.field_2._8_8_);
    psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_558);
    std::__cxx11::string::string((string *)local_530,(string *)psVar3);
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_578,&this->super_cmOutputConverter,(string *)local_530);
    std::__cxx11::string::operator=((string *)local_530,(string *)&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_530);
    str._M_len = auVar8._8_8_;
    directoryLabels.Value = auVar8._0_8_;
    str._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_598,(cmOutputConverter *)directoryLabels.Value,str,in_R8D);
    std::__cxx11::string::operator=((string *)local_530,(string *)&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    poVar4 = std::operator<<((ostream *)local_330,"subdirs(");
    poVar4 = std::operator<<(poVar4,(string *)local_530);
    std::operator<<(poVar4,")\n");
    std::__cxx11::string::~string((string *)local_530);
    __gnu_cxx::
    __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
    ::operator++(&__end1_1);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"CMAKE_DIRECTORY_LABELS",
             (allocator<char> *)((long)&labels.Value + 7));
  local_5b0 = cmMakefile::GetDefinition(pcVar1,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&labels.Value + 7));
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"LABELS",&local_601);
  local_5e0 = cmMakefile::GetProperty(pcVar1,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  bVar2 = cmValue::operator_cast_to_bool(&local_5e0);
  if (!bVar2) {
    bVar2 = cmValue::operator_cast_to_bool(&local_5b0);
    if (!bVar2) goto LAB_00820322;
  }
  std::operator<<((ostream *)local_330,"set_directory_properties(PROPERTIES LABELS ");
  bVar2 = cmValue::operator_cast_to_bool(&local_5e0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_5e0);
    local_638 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    str_00._M_len = local_638._8_8_;
    str_00._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_628,local_638._0_8_,str_00,in_R8D);
    std::operator<<((ostream *)local_330,(string *)&local_628);
    std::__cxx11::string::~string((string *)&local_628);
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_5e0);
  if (bVar2) {
    bVar2 = cmValue::operator_cast_to_bool(&local_5b0);
    if (bVar2) {
      std::operator<<((ostream *)local_330,";");
    }
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_5b0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_5b0);
    auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    str_01._M_len = auVar8._8_8_;
    str_01._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_658,auVar8._0_8_,str_01,in_R8D);
    std::operator<<((ostream *)local_330,(string *)&local_658);
    std::__cxx11::string::~string((string *)&local_658);
  }
  std::operator<<((ostream *)local_330,")\n");
LAB_00820322:
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector(&local_4d8);
  std::__cxx11::string::~string(local_3a0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_330);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  std::string file =
    cmStrCat(this->StateSnapshot.GetDirectory().GetCurrentBinary(),
             "/CTestTestfile.cmake");

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for \n"
          "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n"
          "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << "\n"
          "# \n"
          "# This file includes the relevant testing commands "
          "required for \n"
          "# testing this directory and lists subdirectories to "
          "be tested as well.\n";

  std::string resourceSpecFile =
    this->Makefile->GetSafeDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (!resourceSpecFile.empty()) {
    fout << "set(CTEST_RESOURCE_SPEC_FILE \"" << resourceSpecFile << "\")\n";
  }

  cmValue testIncludeFile = this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << *testIncludeFile << "\")\n";
  }

  cmValue testIncludeFiles = this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    cmList includesList{ *testIncludeFiles };
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")\n";
    }
  }

  // Ask each test generator to write its code.
  for (const auto& tester : this->Makefile->GetTestGenerators()) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  using vec_t = std::vector<cmStateSnapshot>;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeRelativeToCurBinDir(outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")\n";
  }

  // Add directory labels property
  cmValue directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  cmValue labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(*labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(*directoryLabels);
    }
    fout << ")\n";
  }
}